

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined4 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 (*pauVar46) [16];
  byte bVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong *puVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  ulong *puVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar68 [32];
  float fVar81;
  float fVar91;
  float fVar92;
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar93;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  uint uVar102;
  uint uVar103;
  vint4 ai;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint uVar104;
  undefined1 auVar99 [16];
  uint uVar105;
  uint uVar106;
  uint uVar107;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  uint uVar108;
  float fVar109;
  float fVar110;
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar123;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar116;
  float fVar118;
  float fVar120;
  float fVar122;
  float fVar124;
  float fVar126;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar127 [32];
  float fVar128;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  NodeRef stack [244];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar61._4_4_ = uVar2;
  auVar61._0_4_ = uVar2;
  auVar61._8_4_ = uVar2;
  auVar61._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar48 = (tray->tnear).field_0.i[k];
  auVar63._4_4_ = iVar48;
  auVar63._0_4_ = iVar48;
  auVar63._8_4_ = iVar48;
  auVar63._12_4_ = iVar48;
  iVar48 = (tray->tfar).field_0.i[k];
  auVar64._4_4_ = iVar48;
  auVar64._0_4_ = iVar48;
  auVar64._8_4_ = iVar48;
  auVar64._12_4_ = iVar48;
  puVar59 = local_7f8;
LAB_00f77fc5:
  do {
    puVar52 = puVar59;
    if (puVar52 == &local_800) {
LAB_00f784d9:
      return puVar52 != &local_800;
    }
    puVar59 = puVar52 + -1;
    uVar55 = puVar52[-1];
    while ((uVar55 & 8) == 0) {
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + uVar51),auVar60);
      auVar99._0_4_ = auVar67._0_4_ * fVar3;
      auVar99._4_4_ = auVar67._4_4_ * fVar3;
      auVar99._8_4_ = auVar67._8_4_ * fVar3;
      auVar99._12_4_ = auVar67._12_4_ * fVar3;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + uVar53),auVar61);
      auVar82._0_4_ = auVar67._0_4_ * fVar4;
      auVar82._4_4_ = auVar67._4_4_ * fVar4;
      auVar82._8_4_ = auVar67._8_4_ * fVar4;
      auVar82._12_4_ = auVar67._12_4_ * fVar4;
      auVar67 = vpmaxsd_avx(auVar99,auVar82);
      auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + uVar54),auVar62);
      auVar83._0_4_ = auVar99._0_4_ * fVar5;
      auVar83._4_4_ = auVar99._4_4_ * fVar5;
      auVar83._8_4_ = auVar99._8_4_ * fVar5;
      auVar83._12_4_ = auVar99._12_4_ * fVar5;
      auVar99 = vpmaxsd_avx(auVar83,auVar63);
      auVar67 = vpmaxsd_avx(auVar67,auVar99);
      auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + (uVar51 ^ 0x10)),auVar60);
      auVar84._0_4_ = auVar99._0_4_ * fVar3;
      auVar84._4_4_ = auVar99._4_4_ * fVar3;
      auVar84._8_4_ = auVar99._8_4_ * fVar3;
      auVar84._12_4_ = auVar99._12_4_ * fVar3;
      auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + (uVar53 ^ 0x10)),auVar61);
      auVar97._0_4_ = auVar99._0_4_ * fVar4;
      auVar97._4_4_ = auVar99._4_4_ * fVar4;
      auVar97._8_4_ = auVar99._8_4_ * fVar4;
      auVar97._12_4_ = auVar99._12_4_ * fVar4;
      auVar99 = vpminsd_avx(auVar84,auVar97);
      auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar55 + 0x20 + (uVar54 ^ 0x10)),auVar62);
      auVar98._0_4_ = auVar82._0_4_ * fVar5;
      auVar98._4_4_ = auVar82._4_4_ * fVar5;
      auVar98._8_4_ = auVar82._8_4_ * fVar5;
      auVar98._12_4_ = auVar82._12_4_ * fVar5;
      auVar82 = vpminsd_avx(auVar98,auVar64);
      auVar99 = vpminsd_avx(auVar99,auVar82);
      auVar67 = vpcmpgtd_avx(auVar67,auVar99);
      iVar48 = vmovmskps_avx(auVar67);
      if (iVar48 == 0xf) goto LAB_00f77fc5;
      bVar47 = (byte)iVar48 ^ 0xf;
      uVar49 = uVar55 & 0xfffffffffffffff0;
      lVar50 = 0;
      if (bVar47 != 0) {
        for (; (bVar47 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
        }
      }
      uVar55 = *(ulong *)(uVar49 + lVar50 * 8);
      uVar56 = bVar47 - 1 & (uint)bVar47;
      uVar57 = (ulong)uVar56;
      if (uVar56 != 0) {
        do {
          *puVar59 = uVar55;
          puVar59 = puVar59 + 1;
          lVar50 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
            }
          }
          uVar55 = *(ulong *)(uVar49 + lVar50 * 8);
          uVar57 = uVar57 - 1 & uVar57;
        } while (uVar57 != 0);
      }
    }
    uVar49 = uVar55 & 0xfffffffffffffff0;
    for (lVar50 = 0; lVar50 != (ulong)((uint)uVar55 & 0xf) - 8; lVar50 = lVar50 + 1) {
      lVar58 = lVar50 * 0xe0;
      lVar1 = uVar49 + 0xc0 + lVar58;
      local_820 = *(undefined8 *)(lVar1 + 0x10);
      uStack_818 = *(undefined8 *)(lVar1 + 0x18);
      uStack_810 = local_820;
      uStack_808 = uStack_818;
      auVar100._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar58);
      auVar100._0_16_ = *(undefined1 (*) [16])(uVar49 + lVar58);
      auVar85._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x70 + lVar58);
      auVar85._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x10 + lVar58);
      auVar67 = *(undefined1 (*) [16])(uVar49 + 0x80 + lVar58);
      auVar127._16_16_ = auVar67;
      auVar127._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x20 + lVar58);
      auVar99 = *(undefined1 (*) [16])(uVar49 + 0x30 + lVar58);
      auVar111._16_16_ = auVar99;
      auVar111._0_16_ = auVar99;
      lVar1 = uVar49 + 0x40 + lVar58;
      pauVar46 = (undefined1 (*) [16])(lVar1 + 0x10);
      local_980._16_8_ = *(undefined8 *)*pauVar46;
      local_980._0_16_ = *pauVar46;
      local_980._24_8_ = *(undefined8 *)(lVar1 + 0x18);
      auVar99 = *(undefined1 (*) [16])(uVar49 + 0x50 + lVar58);
      auVar129._16_16_ = auVar99;
      auVar129._0_16_ = auVar99;
      auVar99 = *(undefined1 (*) [16])(uVar49 + 0x90 + lVar58);
      auVar130._16_16_ = auVar99;
      auVar130._0_16_ = auVar99;
      auVar99 = *(undefined1 (*) [16])(uVar49 + 0xa0 + lVar58);
      auVar131._16_16_ = auVar99;
      auVar131._0_16_ = auVar99;
      lVar58 = uVar49 + 0xb0 + lVar58;
      pauVar46 = (undefined1 (*) [16])(lVar58 + 0x10);
      uStack_9b0 = *(undefined8 *)*pauVar46;
      _local_9c0 = *pauVar46;
      uStack_9a8 = *(undefined8 *)(lVar58 + 0x18);
      auVar30 = vsubps_avx(auVar100,auVar111);
      auVar31 = vsubps_avx(auVar85,local_980);
      auVar32 = vsubps_avx(auVar127,auVar129);
      auVar33 = vsubps_avx(auVar130,auVar100);
      auVar111 = vsubps_avx(auVar131,auVar85);
      auVar34 = vsubps_avx(_local_9c0,auVar127);
      fVar9 = auVar34._0_4_;
      fVar109 = auVar31._0_4_;
      fVar12 = auVar34._4_4_;
      fVar115 = auVar31._4_4_;
      auVar35._4_4_ = fVar115 * fVar12;
      auVar35._0_4_ = fVar109 * fVar9;
      fVar15 = auVar34._8_4_;
      fVar117 = auVar31._8_4_;
      auVar35._8_4_ = fVar117 * fVar15;
      fVar18 = auVar34._12_4_;
      fVar119 = auVar31._12_4_;
      auVar35._12_4_ = fVar119 * fVar18;
      fVar21 = auVar34._16_4_;
      fVar121 = auVar31._16_4_;
      auVar35._16_4_ = fVar121 * fVar21;
      fVar24 = auVar34._20_4_;
      fVar123 = auVar31._20_4_;
      auVar35._20_4_ = fVar123 * fVar24;
      fVar27 = auVar34._24_4_;
      fVar125 = auVar31._24_4_;
      uVar37 = auVar99._12_4_;
      auVar35._24_4_ = fVar125 * fVar27;
      auVar35._28_4_ = uVar37;
      fVar10 = auVar111._0_4_;
      fVar65 = auVar32._0_4_;
      fVar13 = auVar111._4_4_;
      fVar69 = auVar32._4_4_;
      auVar34._4_4_ = fVar69 * fVar13;
      auVar34._0_4_ = fVar65 * fVar10;
      fVar16 = auVar111._8_4_;
      fVar71 = auVar32._8_4_;
      auVar34._8_4_ = fVar71 * fVar16;
      fVar19 = auVar111._12_4_;
      fVar73 = auVar32._12_4_;
      auVar34._12_4_ = fVar73 * fVar19;
      fVar22 = auVar111._16_4_;
      fVar75 = auVar32._16_4_;
      auVar34._16_4_ = fVar75 * fVar22;
      fVar25 = auVar111._20_4_;
      fVar77 = auVar32._20_4_;
      auVar34._20_4_ = fVar77 * fVar25;
      fVar28 = auVar111._24_4_;
      fVar79 = auVar32._24_4_;
      auVar34._24_4_ = fVar79 * fVar28;
      auVar34._28_4_ = auVar31._28_4_;
      auVar111 = vsubps_avx(auVar34,auVar35);
      fVar11 = auVar33._0_4_;
      fVar14 = auVar33._4_4_;
      auVar31._4_4_ = fVar69 * fVar14;
      auVar31._0_4_ = fVar65 * fVar11;
      fVar17 = auVar33._8_4_;
      auVar31._8_4_ = fVar71 * fVar17;
      fVar20 = auVar33._12_4_;
      auVar31._12_4_ = fVar73 * fVar20;
      fVar23 = auVar33._16_4_;
      auVar31._16_4_ = fVar75 * fVar23;
      fVar26 = auVar33._20_4_;
      auVar31._20_4_ = fVar77 * fVar26;
      fVar29 = auVar33._24_4_;
      auVar31._24_4_ = fVar79 * fVar29;
      auVar31._28_4_ = auVar111._28_4_;
      local_9a0 = auVar30._0_4_;
      fStack_99c = auVar30._4_4_;
      fStack_998 = auVar30._8_4_;
      fStack_994 = auVar30._12_4_;
      fStack_990 = auVar30._16_4_;
      fStack_98c = auVar30._20_4_;
      fStack_988 = auVar30._24_4_;
      uStack_984 = auVar30._28_4_;
      auVar30._4_4_ = fStack_99c * fVar12;
      auVar30._0_4_ = local_9a0 * fVar9;
      auVar30._8_4_ = fStack_998 * fVar15;
      auVar30._12_4_ = fStack_994 * fVar18;
      auVar30._16_4_ = fStack_990 * fVar21;
      auVar30._20_4_ = fStack_98c * fVar24;
      auVar30._24_4_ = fStack_988 * fVar27;
      auVar30._28_4_ = uVar37;
      auVar30 = vsubps_avx(auVar30,auVar31);
      auVar32._4_4_ = fStack_99c * fVar13;
      auVar32._0_4_ = local_9a0 * fVar10;
      auVar32._8_4_ = fStack_998 * fVar16;
      auVar32._12_4_ = fStack_994 * fVar19;
      auVar32._16_4_ = fStack_990 * fVar22;
      auVar32._20_4_ = fStack_98c * fVar25;
      auVar32._24_4_ = fStack_988 * fVar28;
      auVar32._28_4_ = uStack_984;
      auVar33._4_4_ = fVar115 * fVar14;
      auVar33._0_4_ = fVar109 * fVar11;
      auVar33._8_4_ = fVar117 * fVar17;
      auVar33._12_4_ = fVar119 * fVar20;
      auVar33._16_4_ = fVar121 * fVar23;
      auVar33._20_4_ = fVar123 * fVar26;
      auVar33._24_4_ = fVar125 * fVar29;
      auVar33._28_4_ = uVar37;
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar112._4_4_ = uVar2;
      auVar112._0_4_ = uVar2;
      auVar112._8_4_ = uVar2;
      auVar112._12_4_ = uVar2;
      auVar112._16_4_ = uVar2;
      auVar112._20_4_ = uVar2;
      auVar112._24_4_ = uVar2;
      auVar112._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar86._4_4_ = uVar2;
      auVar86._0_4_ = uVar2;
      auVar86._8_4_ = uVar2;
      auVar86._12_4_ = uVar2;
      auVar86._16_4_ = uVar2;
      auVar86._20_4_ = uVar2;
      auVar86._24_4_ = uVar2;
      auVar86._28_4_ = uVar2;
      local_960._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
      local_960._0_4_ = local_960._4_4_;
      local_960._8_4_ = local_960._4_4_;
      local_960._12_4_ = local_960._4_4_;
      local_960._16_4_ = local_960._4_4_;
      local_960._20_4_ = local_960._4_4_;
      local_960._24_4_ = local_960._4_4_;
      local_960._28_4_ = local_960._4_4_;
      fVar128 = *(float *)(ray + k * 4 + 0xa0);
      auVar33 = vsubps_avx(auVar33,auVar32);
      auVar31 = vsubps_avx(auVar100,auVar112);
      fVar6 = *(float *)(ray + k * 4 + 0xc0);
      auVar32 = vsubps_avx(auVar85,auVar86);
      auVar34 = vsubps_avx(auVar127,local_960);
      fVar81 = auVar34._0_4_;
      fVar91 = auVar34._4_4_;
      auVar36._4_4_ = fVar91 * fVar128;
      auVar36._0_4_ = fVar81 * fVar128;
      fVar92 = auVar34._8_4_;
      auVar36._8_4_ = fVar92 * fVar128;
      fVar93 = auVar34._12_4_;
      auVar36._12_4_ = fVar93 * fVar128;
      fVar94 = auVar34._16_4_;
      auVar36._16_4_ = fVar94 * fVar128;
      fVar95 = auVar34._20_4_;
      auVar36._20_4_ = fVar95 * fVar128;
      fVar96 = auVar34._24_4_;
      auVar36._24_4_ = fVar96 * fVar128;
      auVar36._28_4_ = uVar37;
      fVar66 = auVar32._0_4_;
      fVar70 = auVar32._4_4_;
      auVar38._4_4_ = fVar70 * fVar6;
      auVar38._0_4_ = fVar66 * fVar6;
      fVar72 = auVar32._8_4_;
      auVar38._8_4_ = fVar72 * fVar6;
      fVar74 = auVar32._12_4_;
      auVar38._12_4_ = fVar74 * fVar6;
      fVar76 = auVar32._16_4_;
      auVar38._16_4_ = fVar76 * fVar6;
      fVar78 = auVar32._20_4_;
      auVar38._20_4_ = fVar78 * fVar6;
      fVar80 = auVar32._24_4_;
      auVar38._24_4_ = fVar80 * fVar6;
      auVar38._28_4_ = auVar67._12_4_;
      auVar35 = vsubps_avx(auVar38,auVar36);
      fVar7 = *(float *)(ray + k * 4 + 0x80);
      fVar110 = auVar31._0_4_;
      fVar116 = auVar31._4_4_;
      auVar39._4_4_ = fVar116 * fVar6;
      auVar39._0_4_ = fVar110 * fVar6;
      fVar118 = auVar31._8_4_;
      auVar39._8_4_ = fVar118 * fVar6;
      fVar120 = auVar31._12_4_;
      auVar39._12_4_ = fVar120 * fVar6;
      fVar122 = auVar31._16_4_;
      auVar39._16_4_ = fVar122 * fVar6;
      fVar124 = auVar31._20_4_;
      auVar39._20_4_ = fVar124 * fVar6;
      fVar126 = auVar31._24_4_;
      auVar39._24_4_ = fVar126 * fVar6;
      auVar39._28_4_ = uVar37;
      auVar40._4_4_ = fVar91 * fVar7;
      auVar40._0_4_ = fVar81 * fVar7;
      auVar40._8_4_ = fVar92 * fVar7;
      auVar40._12_4_ = fVar93 * fVar7;
      auVar40._16_4_ = fVar94 * fVar7;
      auVar40._20_4_ = fVar95 * fVar7;
      auVar40._24_4_ = fVar96 * fVar7;
      auVar40._28_4_ = auVar34._28_4_;
      auVar36 = vsubps_avx(auVar40,auVar39);
      auVar41._4_4_ = fVar70 * fVar7;
      auVar41._0_4_ = fVar66 * fVar7;
      auVar41._8_4_ = fVar72 * fVar7;
      auVar41._12_4_ = fVar74 * fVar7;
      auVar41._16_4_ = fVar76 * fVar7;
      auVar41._20_4_ = fVar78 * fVar7;
      auVar41._24_4_ = fVar80 * fVar7;
      auVar41._28_4_ = uVar37;
      auVar42._4_4_ = fVar116 * fVar128;
      auVar42._0_4_ = fVar110 * fVar128;
      auVar42._8_4_ = fVar118 * fVar128;
      auVar42._12_4_ = fVar120 * fVar128;
      auVar42._16_4_ = fVar122 * fVar128;
      auVar42._20_4_ = fVar124 * fVar128;
      auVar42._24_4_ = fVar126 * fVar128;
      auVar42._28_4_ = auVar31._28_4_;
      auVar31 = vsubps_avx(auVar42,auVar41);
      local_9c0._0_4_ = auVar30._0_4_;
      local_9c0._4_4_ = auVar30._4_4_;
      fStack_9b8 = auVar30._8_4_;
      fStack_9b4 = auVar30._12_4_;
      uStack_9b0._0_4_ = auVar30._16_4_;
      uStack_9b0._4_4_ = auVar30._20_4_;
      uStack_9a8._0_4_ = auVar30._24_4_;
      fVar43 = auVar32._28_4_;
      auVar68._0_4_ =
           auVar111._0_4_ * fVar7 + fVar128 * (float)local_9c0._0_4_ + auVar33._0_4_ * fVar6;
      auVar68._4_4_ =
           auVar111._4_4_ * fVar7 + fVar128 * (float)local_9c0._4_4_ + auVar33._4_4_ * fVar6;
      auVar68._8_4_ = auVar111._8_4_ * fVar7 + fVar128 * fStack_9b8 + auVar33._8_4_ * fVar6;
      auVar68._12_4_ = auVar111._12_4_ * fVar7 + fVar128 * fStack_9b4 + auVar33._12_4_ * fVar6;
      auVar68._16_4_ =
           auVar111._16_4_ * fVar7 + fVar128 * (float)uStack_9b0 + auVar33._16_4_ * fVar6;
      auVar68._20_4_ = auVar111._20_4_ * fVar7 + fVar128 * uStack_9b0._4_4_ + auVar33._20_4_ * fVar6
      ;
      auVar68._24_4_ =
           auVar111._24_4_ * fVar7 + fVar128 * (float)uStack_9a8 + auVar33._24_4_ * fVar6;
      auVar68._28_4_ = fVar6 + fVar43 + fVar6;
      local_920 = auVar35._0_4_;
      fStack_91c = auVar35._4_4_;
      fStack_918 = auVar35._8_4_;
      fStack_914 = auVar35._12_4_;
      fStack_910 = auVar35._16_4_;
      fStack_90c = auVar35._20_4_;
      fStack_908 = auVar35._24_4_;
      fVar128 = fVar7 + fVar6 + fVar7;
      auVar101._8_4_ = 0x80000000;
      auVar101._0_8_ = 0x8000000080000000;
      auVar101._12_4_ = 0x80000000;
      auVar101._16_4_ = 0x80000000;
      auVar101._20_4_ = 0x80000000;
      auVar101._24_4_ = 0x80000000;
      auVar101._28_4_ = 0x80000000;
      auVar30 = vandps_avx(auVar68,auVar101);
      uVar56 = auVar30._0_4_;
      auVar113._0_4_ =
           (float)(uVar56 ^ (uint)(local_920 * fVar11 +
                                  auVar31._0_4_ * fVar9 + auVar36._0_4_ * fVar10));
      uVar102 = auVar30._4_4_;
      auVar113._4_4_ =
           (float)(uVar102 ^
                  (uint)(fStack_91c * fVar14 + auVar31._4_4_ * fVar12 + auVar36._4_4_ * fVar13));
      uVar103 = auVar30._8_4_;
      auVar113._8_4_ =
           (float)(uVar103 ^
                  (uint)(fStack_918 * fVar17 + auVar31._8_4_ * fVar15 + auVar36._8_4_ * fVar16));
      uVar104 = auVar30._12_4_;
      auVar113._12_4_ =
           (float)(uVar104 ^
                  (uint)(fStack_914 * fVar20 + auVar31._12_4_ * fVar18 + auVar36._12_4_ * fVar19));
      uVar105 = auVar30._16_4_;
      auVar113._16_4_ =
           (float)(uVar105 ^
                  (uint)(fStack_910 * fVar23 + auVar31._16_4_ * fVar21 + auVar36._16_4_ * fVar22));
      uVar106 = auVar30._20_4_;
      auVar113._20_4_ =
           (float)(uVar106 ^
                  (uint)(fStack_90c * fVar26 + auVar31._20_4_ * fVar24 + auVar36._20_4_ * fVar25));
      uVar107 = auVar30._24_4_;
      auVar113._24_4_ =
           (float)(uVar107 ^
                  (uint)(fStack_908 * fVar29 + auVar31._24_4_ * fVar27 + auVar36._24_4_ * fVar28));
      uVar108 = auVar30._28_4_;
      auVar113._28_4_ = (float)(uVar108 ^ (uint)fVar128);
      auVar87._0_4_ =
           (float)(uVar56 ^ (uint)(local_920 * local_9a0 +
                                  auVar31._0_4_ * fVar65 + auVar36._0_4_ * fVar109));
      auVar87._4_4_ =
           (float)(uVar102 ^
                  (uint)(fStack_91c * fStack_99c + auVar31._4_4_ * fVar69 + auVar36._4_4_ * fVar115)
                  );
      auVar87._8_4_ =
           (float)(uVar103 ^
                  (uint)(fStack_918 * fStack_998 + auVar31._8_4_ * fVar71 + auVar36._8_4_ * fVar117)
                  );
      auVar87._12_4_ =
           (float)(uVar104 ^
                  (uint)(fStack_914 * fStack_994 +
                        auVar31._12_4_ * fVar73 + auVar36._12_4_ * fVar119));
      auVar87._16_4_ =
           (float)(uVar105 ^
                  (uint)(fStack_910 * fStack_990 +
                        auVar31._16_4_ * fVar75 + auVar36._16_4_ * fVar121));
      auVar87._20_4_ =
           (float)(uVar106 ^
                  (uint)(fStack_90c * fStack_98c +
                        auVar31._20_4_ * fVar77 + auVar36._20_4_ * fVar123));
      auVar87._24_4_ =
           (float)(uVar107 ^
                  (uint)(fStack_908 * fStack_988 +
                        auVar31._24_4_ * fVar79 + auVar36._24_4_ * fVar125));
      auVar87._28_4_ = (float)(uVar108 ^ (uint)(fVar128 + fVar6 + fVar7 + auVar36._28_4_));
      auVar30 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,5);
      auVar31 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,5);
      auVar30 = vandps_avx(auVar30,auVar31);
      auVar31 = vcmpps_avx(auVar68,ZEXT832(0) << 0x20,4);
      auVar30 = vandps_avx(auVar30,auVar31);
      auVar88._0_4_ = auVar113._0_4_ + auVar87._0_4_;
      auVar88._4_4_ = auVar113._4_4_ + auVar87._4_4_;
      auVar88._8_4_ = auVar113._8_4_ + auVar87._8_4_;
      auVar88._12_4_ = auVar113._12_4_ + auVar87._12_4_;
      auVar88._16_4_ = auVar113._16_4_ + auVar87._16_4_;
      auVar88._20_4_ = auVar113._20_4_ + auVar87._20_4_;
      auVar88._24_4_ = auVar113._24_4_ + auVar87._24_4_;
      auVar88._28_4_ = auVar113._28_4_ + auVar87._28_4_;
      auVar114._8_4_ = 0x7fffffff;
      auVar114._0_8_ = 0x7fffffff7fffffff;
      auVar114._12_4_ = 0x7fffffff;
      auVar114._16_4_ = 0x7fffffff;
      auVar114._20_4_ = 0x7fffffff;
      auVar114._24_4_ = 0x7fffffff;
      auVar114._28_4_ = 0x7fffffff;
      auVar31 = vandps_avx(auVar68,auVar114);
      auVar32 = vcmpps_avx(auVar88,auVar31,2);
      auVar35 = auVar32 & auVar30;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar30 = vandps_avx(auVar30,auVar32);
        auVar67 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
        auVar89._0_4_ =
             uVar56 ^ (uint)(auVar111._0_4_ * fVar110 +
                            fVar66 * (float)local_9c0._0_4_ + fVar81 * auVar33._0_4_);
        auVar89._4_4_ =
             uVar102 ^ (uint)(auVar111._4_4_ * fVar116 +
                             fVar70 * (float)local_9c0._4_4_ + fVar91 * auVar33._4_4_);
        auVar89._8_4_ =
             uVar103 ^ (uint)(auVar111._8_4_ * fVar118 +
                             fVar72 * fStack_9b8 + fVar92 * auVar33._8_4_);
        auVar89._12_4_ =
             uVar104 ^ (uint)(auVar111._12_4_ * fVar120 +
                             fVar74 * fStack_9b4 + fVar93 * auVar33._12_4_);
        auVar89._16_4_ =
             uVar105 ^ (uint)(auVar111._16_4_ * fVar122 +
                             fVar76 * (float)uStack_9b0 + fVar94 * auVar33._16_4_);
        auVar89._20_4_ =
             uVar106 ^ (uint)(auVar111._20_4_ * fVar124 +
                             fVar78 * uStack_9b0._4_4_ + fVar95 * auVar33._20_4_);
        auVar89._24_4_ =
             uVar107 ^ (uint)(auVar111._24_4_ * fVar126 +
                             fVar80 * (float)uStack_9a8 + fVar96 * auVar33._24_4_);
        auVar89._28_4_ = uVar108 ^ (uint)(fVar43 + fVar43 + auVar34._28_4_);
        fVar128 = *(float *)(ray + k * 4 + 0x60);
        auVar44._4_4_ = auVar31._4_4_ * fVar128;
        auVar44._0_4_ = auVar31._0_4_ * fVar128;
        auVar44._8_4_ = auVar31._8_4_ * fVar128;
        auVar44._12_4_ = auVar31._12_4_ * fVar128;
        auVar44._16_4_ = auVar31._16_4_ * fVar128;
        auVar44._20_4_ = auVar31._20_4_ * fVar128;
        auVar44._24_4_ = auVar31._24_4_ * fVar128;
        auVar44._28_4_ = fVar128;
        auVar30 = vcmpps_avx(auVar44,auVar89,1);
        fVar128 = *(float *)(ray + k * 4 + 0x100);
        auVar45._4_4_ = auVar31._4_4_ * fVar128;
        auVar45._0_4_ = auVar31._0_4_ * fVar128;
        auVar45._8_4_ = auVar31._8_4_ * fVar128;
        auVar45._12_4_ = auVar31._12_4_ * fVar128;
        auVar45._16_4_ = auVar31._16_4_ * fVar128;
        auVar45._20_4_ = auVar31._20_4_ * fVar128;
        auVar45._24_4_ = auVar31._24_4_ * fVar128;
        auVar45._28_4_ = auVar31._28_4_;
        auVar31 = vcmpps_avx(auVar89,auVar45,2);
        auVar30 = vandps_avx(auVar30,auVar31);
        auVar99 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
        auVar67 = vpand_avx(auVar99,auVar67);
        auVar99 = vpmovzxwd_avx(auVar67);
        auVar90._0_16_ = vpslld_avx(auVar99,0x1f);
        auVar99 = vpunpckhwd_avx(auVar67,auVar67);
        auVar99 = vpslld_avx(auVar99,0x1f);
        auVar90._16_16_ = auVar99;
        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar90 >> 0x7f,0) != '\0') ||
              (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar99 >> 0x3f,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar99[0xf] < '\0') {
          auVar67 = vpsllw_avx(auVar67,0xf);
          auVar67 = vpacksswb_avx(auVar67,auVar67);
          uVar57 = (ulong)(byte)(SUB161(auVar67 >> 7,0) & 1 | (SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar67 >> 0x3f,0) << 7);
          do {
            uVar8 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)((long)&local_820 + uVar8 * 4)].ptr)->
                 mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_00f784d9;
            }
            uVar57 = uVar57 ^ 1L << (uVar8 & 0x3f);
          } while (uVar57 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }